

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O2

_Bool remove_pending_delivery_condition_function
                (void *item,void *match_context,_Bool *continue_processing)

{
  *continue_processing = item != match_context;
  return item == match_context;
}

Assistant:

static bool remove_pending_delivery_condition_function(const void* item, const void* match_context, bool* continue_processing)
{
    bool result;

    if (item == match_context)
    {
        result = true;
        *continue_processing = false;
    }
    else
    {
        result = false;
        *continue_processing = true;
    }

    return result;
}